

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O3

bool axl::io::matchWildcard(StringRef *string0,StringRef *wildcard0)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  char *pcVar6;
  char cVar7;
  
  if (wildcard0->m_length == 0) {
    pcVar2 = &sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  else {
    pcVar2 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::ensureNullTerminated
                       (wildcard0);
  }
  if (string0->m_length == 0) {
    do {
      cVar7 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar7 == '*');
  }
  else {
    pcVar3 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::ensureNullTerminated
                       (string0);
    pcVar4 = (char *)0x0;
    pcVar6 = (char *)0x0;
    do {
      cVar7 = *pcVar2;
      if (cVar7 != '*') {
        do {
          while( true ) {
            if ((cVar7 == '?') || (cVar5 = *pcVar3, cVar5 == cVar7)) goto LAB_00137871;
            if (pcVar6 == (char *)0x0) {
              return false;
            }
            if ((pcVar2 != pcVar6) && (cVar7 = *pcVar6, pcVar2 = pcVar6 + 1, cVar5 != cVar7)) break;
            if (cVar5 == '\0') {
              return false;
            }
            pcVar3 = pcVar3 + 1;
            cVar7 = *pcVar2;
            if (cVar7 == '*') goto LAB_00137852;
          }
          pcVar3 = pcVar4 + 1;
          pcVar4 = pcVar3;
          pcVar2 = pcVar6;
        } while (cVar7 != '*');
      }
LAB_00137852:
      do {
        cVar7 = pcVar2[1];
        pcVar6 = pcVar2 + 1;
        pcVar2 = pcVar6;
      } while (cVar7 == '*');
      if (cVar7 == '\0') {
        return true;
      }
      pcVar4 = pcVar3;
      if (cVar7 != '?') {
        cVar5 = *pcVar3;
        while (pcVar4 = pcVar3, cVar5 != cVar7) {
          cVar5 = pcVar3[1];
          pcVar3 = pcVar3 + 1;
          if (cVar5 == '\0') {
            return false;
          }
        }
      }
LAB_00137871:
      pcVar2 = pcVar2 + 1;
      pcVar1 = pcVar3 + 1;
      pcVar3 = pcVar3 + 1;
    } while (*pcVar1 != '\0');
    do {
      cVar7 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar7 == '*');
  }
  return cVar7 == '\0';
}

Assistant:

bool
matchWildcard(
	const sl::StringRef& string0,
	const sl::StringRef& wildcard0
) {
	const char* wildcard = wildcard0.sz();

	if (string0.isEmpty()) { // empty input shortcut
		while (*wildcard == '*')
			wildcard++;

		return *wildcard == '\0';
	}

	const char* string = string0.sz();
	const char* stringBookmark = NULL;
	const char* wildcardBookmark = NULL;
	char c;

	for (;;) {
		if (*wildcard == '*') {
			while (*++wildcard == '*')
				;

			if (!*wildcard)
				return true;

			if (*wildcard != '?') {
				while (*string != *wildcard) {
					if (!(*(++string)))
						return false;
				}
			}

			wildcardBookmark = wildcard;
			stringBookmark = string;
		} else {
			c = *string;
			if (c != *wildcard && *wildcard != '?') {
				if (wildcardBookmark) {
					if (wildcard != wildcardBookmark) {
						wildcard = wildcardBookmark;

						if (c != *wildcard) {
							string = ++stringBookmark;
							continue;
						} else {
							wildcard++;
						}
					}

					if (*string) {
						string++;
						continue;
					}
				}

				return false;
			}
		}

		string++;
		wildcard++;

		if (!*string) {
			while (*wildcard == '*')
				wildcard++;

			return !*wildcard;
		}
	}
}